

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

VkPipelineSampleLocationsStateCreateInfoEXT * __thiscall
Fossilize::StateRecorder::Impl::copy<VkPipelineSampleLocationsStateCreateInfoEXT>
          (Impl *this,VkPipelineSampleLocationsStateCreateInfoEXT *src,size_t count,
          ScratchAllocator *alloc)

{
  VkPipelineSampleLocationsStateCreateInfoEXT *new_data;
  ScratchAllocator *alloc_local;
  size_t count_local;
  VkPipelineSampleLocationsStateCreateInfoEXT *src_local;
  Impl *this_local;
  
  if (count == 0) {
    this_local = (Impl *)0x0;
  }
  else {
    this_local = (Impl *)ScratchAllocator::allocate_n<VkPipelineSampleLocationsStateCreateInfoEXT>
                                   (alloc,count);
    if (this_local != (Impl *)0x0) {
      std::
      copy<VkPipelineSampleLocationsStateCreateInfoEXT_const*,VkPipelineSampleLocationsStateCreateInfoEXT*>
                (src,src + count,(VkPipelineSampleLocationsStateCreateInfoEXT *)this_local);
    }
  }
  return (VkPipelineSampleLocationsStateCreateInfoEXT *)this_local;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}